

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

void free_sh(JSRuntime *rt,JSOSSignalHandler *sh)

{
  int iVar1;
  list_head *plVar2;
  list_head *plVar3;
  int64_t iVar4;
  JSValueUnion JVar5;
  JSValue v;
  
  plVar2 = (sh->link).prev;
  plVar3 = (sh->link).next;
  plVar2->next = plVar3;
  plVar3->prev = plVar2;
  (sh->link).prev = (list_head *)0x0;
  (sh->link).next = (list_head *)0x0;
  iVar4 = (sh->func).tag;
  if (0xfffffff4 < (uint)iVar4) {
    JVar5 = (JSValueUnion)(sh->func).u.ptr;
    iVar1 = *JVar5.ptr;
    *(int *)JVar5.ptr = iVar1 + -1;
    if (iVar1 < 2) {
      v.tag = iVar4;
      v.u.ptr = JVar5.ptr;
      __JS_FreeValueRT(rt,v);
    }
  }
  js_free_rt(rt,sh);
  return;
}

Assistant:

static void free_sh(JSRuntime *rt, JSOSSignalHandler *sh)
{
    list_del(&sh->link);
    JS_FreeValueRT(rt, sh->func);
    js_free_rt(rt, sh);
}